

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

void free_trophy(TROPHY_DATA *trophy)

{
  string_view fmt;
  
  if (trophy != (TROPHY_DATA *)0x0) {
    if (trophy->next != (TROPHY_DATA *)0x0) {
      free_trophy(trophy->next);
    }
    operator_delete(trophy,0x10);
    return;
  }
  fmt._M_str = "ERROR: Null trophy freed!";
  fmt._M_len = 0x19;
  CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  return;
}

Assistant:

void free_trophy(TROPHY_DATA *trophy)
{
	if (!trophy)
	{
		RS.Logger.Warn("ERROR: Null trophy freed!");
		return;
	}

	if (trophy->next == nullptr)
	{
		delete trophy;
	}
	else
	{
		free_trophy(trophy->next);
		delete trophy;
	}
}